

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.cpp
# Opt level: O1

void __thiscall Automaton::closure(Automaton *this,StatePointer state)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  Grammar *pGVar3;
  QMapData<std::multimap<std::_List_iterator<QString>,_std::_List_iterator<Rule>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>_>_>
  *pQVar4;
  State *pSVar5;
  State *pSVar6;
  iterator iVar7;
  _Bucket *p_Var8;
  _List_node_base *p_Var9;
  const_iterator cVar10;
  _Rb_tree_const_iterator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>
  _Var11;
  _Rb_tree_node_base *p_Var12;
  iterator iVar13;
  _Node_alloc_type *__alloc;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>_>
  pVar14;
  pair<std::_List_iterator<Item>,_bool> pVar15;
  pair<std::_List_iterator<State>,_bool> pVar16;
  State local_c8;
  QArrayData *local_78;
  undefined8 uStack_70;
  qsizetype local_68;
  QMap<std::_List_iterator<QString>,__Bucket> local_60;
  undefined1 local_58 [8];
  _List_iterator<State> *p_Stack_50;
  qsizetype local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (state._M_node[2]._M_prev == (_List_node_base *)&state._M_node[2]._M_prev) {
    pSVar6 = (State *)(state._M_node + 1);
    local_60.d.d.ptr =
         (QExplicitlySharedDataPointerV2<QMapData<std::map<std::_List_iterator<QString>,__Bucket,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,__Bucket>_>_>_>_>
          )(totally_ordered_wrapper<QMapData<std::map<std::_List_iterator<QString>,__Bucket,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,__Bucket>_>_>_>_*>
            )0x0;
    local_78 = (QArrayData *)0x0;
    uStack_70 = 0;
    local_68 = 0;
    local_c8.kernel.super__List_base<Item,_std::allocator<Item>_>._M_impl._M_node.
    super__List_node_base._M_next =
         (pSVar6->kernel).super__List_base<Item,_std::allocator<Item>_>._M_impl._M_node.
         super__List_node_base._M_next;
    if ((State *)local_c8.kernel.super__List_base<Item,_std::allocator<Item>_>._M_impl._M_node.
                 super__List_node_base._M_next != pSVar6) {
      do {
        QtPrivate::QMovableArrayOps<std::_List_iterator<Item>>::
        emplace<std::_List_iterator<Item>const&>
                  ((QMovableArrayOps<std::_List_iterator<Item>> *)&local_78,local_68,
                   (_List_iterator<Item> *)&local_c8);
        QList<std::_List_iterator<Item>_>::end((QList<std::_List_iterator<Item>_> *)&local_78);
        local_c8.kernel.super__List_base<Item,_std::allocator<Item>_>._M_impl._M_node.
        super__List_node_base._M_next =
             (((ItemList *)
              &(local_c8.kernel.super__List_base<Item,_std::allocator<Item>_>._M_impl._M_node.
                super__List_node_base._M_next)->_M_next)->
             super__List_base<Item,_std::allocator<Item>_>)._M_impl._M_node.super__List_node_base.
             _M_next;
      } while ((State *)local_c8.kernel.super__List_base<Item,_std::allocator<Item>_>._M_impl.
                        _M_node.super__List_node_base._M_next != pSVar6);
    }
    std::__cxx11::list<Item,std::allocator<Item>>::
    _M_assign_dispatch<std::_List_const_iterator<Item>>
              ((list<Item,std::allocator<Item>> *)&state._M_node[2]._M_prev,
               (pSVar6->kernel).super__List_base<Item,_std::allocator<Item>_>._M_impl._M_node.
               super__List_node_base._M_next,pSVar6);
    if (local_68 != 0) {
      do {
        iVar7 = QList<std::_List_iterator<Item>_>::end
                          ((QList<std::_List_iterator<Item>_> *)&local_78);
        p_Var2 = iVar7.i[-1]._M_node;
        QList<std::_List_iterator<Item>_>::end((QList<std::_List_iterator<Item>_> *)&local_78);
        local_68 = local_68 + -1;
        if (p_Var2[1]._M_prev != (_List_node_base *)&p_Var2[1]._M_next[1]._M_prev) {
          p_Var8 = QMap<std::_List_iterator<QString>,__Bucket>::operator[]
                             (&local_60,(_List_iterator<QString> *)(p_Var2[1]._M_prev + 1));
          p_Var9 = (_List_node_base *)operator_new(0x18);
          p_Var9[1]._M_next = p_Var2;
          std::__detail::_List_node_base::_M_hook(p_Var9);
          psVar1 = &(p_Var8->items).
                    super__List_base<std::_List_iterator<Item>,_std::allocator<std::_List_iterator<Item>_>_>
                    ._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          pGVar3 = this->_M_grammar;
          local_c8.kernel.super__List_base<Item,_std::allocator<Item>_>._M_impl._M_node.
          super__List_node_base._M_next = p_Var2[1]._M_prev[1]._M_next;
          cVar10 = std::
                   _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                   ::find(&(pGVar3->non_terminals)._M_t,(key_type *)&local_c8);
          if ((_Rb_tree_header *)cVar10._M_node !=
              &(pGVar3->non_terminals)._M_t._M_impl.super__Rb_tree_header) {
            pQVar4 = (this->_M_grammar->rule_map).d.d.ptr;
            if (pQVar4 == (QMapData<std::multimap<std::_List_iterator<QString>,_std::_List_iterator<Rule>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>_>_>
                           *)0x0) {
              pVar14 = (pair<std::_Rb_tree_const_iterator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>_>
                        )ZEXT816(0);
            }
            else {
              pVar14 = std::
                       _Rb_tree<std::_List_iterator<QString>,_std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>,_std::_Select1st<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>_>
                       ::equal_range(&(pQVar4->m)._M_t,(key_type *)(p_Var2[1]._M_prev + 1));
            }
            for (_Var11 = pVar14.first._M_node; _Var11._M_node != pVar14.second._M_node._M_node;
                _Var11._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var11._M_node)) {
              local_c8.kernel.super__List_base<Item,_std::allocator<Item>_>._M_impl._M_node.
              super__List_node_base._M_next = (_List_node_base *)_Var11._M_node[1]._M_parent;
              local_c8.kernel.super__List_base<Item,_std::allocator<Item>_>._M_impl._M_node.
              super__List_node_base._M_prev =
                   (((State *)
                    local_c8.kernel.super__List_base<Item,_std::allocator<Item>_>._M_impl._M_node.
                    super__List_node_base._M_next)->closure).
                   super__List_base<Item,_std::allocator<Item>_>._M_impl._M_node.
                   super__List_node_base._M_next;
              local_58 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
              p_Stack_50 = (_List_iterator<State> *)&DAT_aaaaaaaaaaaaaaaa;
              pVar15 = State::insertClosure(pSVar6,(Item *)&local_c8);
              local_58 = (undefined1  [8])pVar15.first._M_node;
              p_Stack_50 = (_List_iterator<State> *)CONCAT71(p_Stack_50._1_7_,pVar15.second);
              if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                QtPrivate::QMovableArrayOps<std::_List_iterator<Item>>::
                emplace<std::_List_iterator<Item>const&>
                          ((QMovableArrayOps<std::_List_iterator<Item>> *)&local_78,local_68,
                           (_List_iterator<Item> *)local_58);
                QList<std::_List_iterator<Item>_>::end
                          ((QList<std::_List_iterator<Item>_> *)&local_78);
              }
            }
          }
        }
      } while (local_68 != 0);
    }
    local_58 = (undefined1  [8])0x0;
    p_Stack_50 = (_List_iterator<State> *)0x0;
    local_48 = 0;
    QMap<std::_List_iterator<QString>,__Bucket>::detach(&local_60);
    p_Var12 = *(_Base_ptr *)((long)local_60.d.d.ptr + 0x20);
    QMap<std::_List_iterator<QString>,__Bucket>::detach(&local_60);
    if (p_Var12 != (_Rb_tree_node_base *)((long)local_60.d.d.ptr + 0x10)) {
      do {
        _Bucket::toState(&local_c8,(_Bucket *)&p_Var12[1]._M_parent,this);
        pVar16 = internState(this,&local_c8);
        QtPrivate::
        QExplicitlySharedDataPointerV2<QMapData<std::map<std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>_>_>_>_>
        ::~QExplicitlySharedDataPointerV2(&local_c8.follows.d);
        QtPrivate::
        QExplicitlySharedDataPointerV2<QMapData<std::map<std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>_>_>_>_>
        ::~QExplicitlySharedDataPointerV2(&local_c8.reads.d);
        QtPrivate::
        QExplicitlySharedDataPointerV2<QMapData<std::map<std::_List_iterator<QString>,_std::_List_iterator<State>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>_>_>_>_>
        ::~QExplicitlySharedDataPointerV2(&local_c8.bundle.d);
        p_Var2 = local_c8.closure.super__List_base<Item,_std::allocator<Item>_>._M_impl._M_node.
                 super__List_node_base._M_next;
        while (pSVar6 = (State *)local_c8.kernel.super__List_base<Item,_std::allocator<Item>_>.
                                 _M_impl._M_node.super__List_node_base._M_next,
              p_Var2 != (_List_node_base *)&local_c8.closure) {
          p_Var9 = p_Var2->_M_next;
          operator_delete(p_Var2,0x20);
          p_Var2 = p_Var9;
        }
        while (pSVar6 != &local_c8) {
          pSVar5 = (State *)(pSVar6->kernel).super__List_base<Item,_std::allocator<Item>_>._M_impl.
                            _M_node.super__List_node_base._M_next;
          operator_delete(pSVar6,0x20);
          pSVar6 = pSVar5;
        }
        local_c8.kernel.super__List_base<Item,_std::allocator<Item>_>._M_impl._M_node.
        super__List_node_base._M_next = pVar16.first._M_node._M_node;
        if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          QtPrivate::QMovableArrayOps<std::_List_iterator<State>>::
          emplace<std::_List_iterator<State>const&>
                    ((QMovableArrayOps<std::_List_iterator<State>> *)local_58,local_48,
                     (_List_iterator<State> *)&local_c8);
          QList<std::_List_iterator<State>_>::end((QList<std::_List_iterator<State>_> *)local_58);
        }
        QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::insert
                  ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)
                   (state._M_node + 4),(_List_iterator<QString> *)(p_Var12 + 1),
                   (_List_iterator<State> *)&local_c8);
        p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
        QMap<std::_List_iterator<QString>,__Bucket>::detach(&local_60);
      } while (p_Var12 != (_Rb_tree_node_base *)((long)local_60.d.d.ptr + 0x10));
    }
    if (local_48 != 0) {
      do {
        iVar13 = QList<std::_List_iterator<State>_>::begin
                           ((QList<std::_List_iterator<State>_> *)local_58);
        closure(this,(iVar13.i)->_M_node);
        QList<std::_List_iterator<State>_>::pop_front
                  ((QList<std::_List_iterator<State>_> *)local_58);
      } while (local_48 != 0);
    }
    if (local_58 != (undefined1  [8])0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_58)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_58)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_58)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_58,8,0x10);
      }
    }
    if (local_78 != (QArrayData *)0x0) {
      LOCK();
      (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_78,8,0x10);
      }
    }
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<std::_List_iterator<QString>,__Bucket,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,__Bucket>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2(&local_60.d);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Automaton::closure (StatePointer state)
{
  if (! state->closure.empty ()) // ### not true.
    return;

  typedef QMap<Name, _Bucket> bucket_map_type;

  bucket_map_type buckets;
  QStack<ItemPointer> working_list;

  for (ItemPointer item = state->kernel.begin (); item != state->kernel.end (); ++item)
    working_list.push (item);

  state->closure = state->kernel;

  while (! working_list.empty ())
    {
      ItemPointer item = working_list.top ();
      working_list.pop ();

      if (item->isReduceItem ())
        continue;

      buckets [*item->dot].insert (item);

      if (_M_grammar->isNonTerminal (*item->dot))
        {
          const auto range = std::as_const(_M_grammar->rule_map).equal_range(*item->dot);
          for (auto it = range.first; it != range.second; ++it)
            {
              const RulePointer &rule = *it;
              Item ii;
              ii.rule = rule;
              ii.dot = rule->rhs.begin ();

              std::pair<ItemPointer, bool> r = state->insertClosure(ii);

              if (r.second)
                working_list.push (r.first);
            }
        }
    }

  QList<StatePointer> todo;

  for (bucket_map_type::iterator bucket = buckets.begin (); bucket != buckets.end (); ++bucket)
    {
      std::pair<StatePointer, bool> r = internState(bucket->toState(this));

      StatePointer target = r.first;

      if (r.second)
        todo.push_back (target);

      state->bundle.insert (bucket.key(), target);
    }

  while (! todo.empty ())
    {
      closure (todo.front ());
      todo.pop_front ();
    }
}